

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

string * __thiscall
spvtools::val::ValidationState_t::getIdName_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,uint32_t id)

{
  ostream *poVar1;
  string id_name;
  stringstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
  ::operator()(&bStack_1c8,&this->name_mapper_,id);
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"\'");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"[%");
  poVar1 = std::operator<<(poVar1,(string *)&bStack_1c8);
  std::operator<<(poVar1,"]\'");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string ValidationState_t::getIdName(uint32_t id) const {
  const std::string id_name = name_mapper_(id);

  std::stringstream out;
  out << "'" << id << "[%" << id_name << "]'";
  return out.str();
}